

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::FtraceConfig::~FtraceConfig(FtraceConfig *this)

{
  FtraceConfig *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FtraceConfig_009c1228;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  protozero::CopyablePtr<perfetto::protos::gen::FtraceConfig_CompactSchedConfig>::~CopyablePtr
            (&this->compact_sched_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->atrace_apps_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->atrace_categories_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ftrace_events_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

FtraceConfig::~FtraceConfig() = default;